

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnWriter::CompressPage
          (ColumnWriter *this,MemoryStream *temp_writer,size_t *compressed_size,
          data_ptr_t *compressed_data,AllocatedData *compressed_buf)

{
  int iVar1;
  size_t sVar2;
  idx_t iVar3;
  Allocator *pAVar4;
  data_ptr_t pdVar5;
  ulong uVar6;
  mz_ulong mVar7;
  data_ptr_t pdVar8;
  InternalException *pIVar9;
  MiniZStream s;
  AllocatedData local_48;
  
  switch(this->writer->codec) {
  case UNCOMPRESSED:
    iVar3 = MemoryStream::GetPosition(temp_writer);
    *compressed_size = iVar3;
    pdVar8 = MemoryStream::GetData(temp_writer);
    goto LAB_01df0a54;
  case SNAPPY:
    iVar3 = MemoryStream::GetPosition(temp_writer);
    sVar2 = duckdb_snappy::MaxCompressedLength(iVar3);
    *compressed_size = sVar2;
    pAVar4 = BufferAllocator::Get(this->writer->context);
    Allocator::Allocate((AllocatedData *)&s,pAVar4,*compressed_size);
    AllocatedData::operator=(compressed_buf,(AllocatedData *)&s);
    AllocatedData::~AllocatedData((AllocatedData *)&s);
    pdVar8 = MemoryStream::GetData(temp_writer);
    iVar3 = MemoryStream::GetPosition(temp_writer);
    duckdb_snappy::RawCompress((char *)pdVar8,iVar3,(char *)compressed_buf->pointer,compressed_size)
    ;
    pdVar8 = compressed_buf->pointer;
LAB_01df0a54:
    *compressed_data = pdVar8;
    break;
  case GZIP:
    s.stream.adler = 0;
    s.stream.reserved = 0;
    s.stream.opaque = (void *)0x0;
    s.stream.data_type = 0;
    s.stream._92_4_ = 0;
    s.stream.zalloc = (mz_alloc_func)0x0;
    s.stream.zfree = (mz_free_func)0x0;
    s.stream.msg = (char *)0x0;
    s.stream.state = (mz_internal_state *)0x0;
    s.stream.avail_out = 0;
    s.stream._36_4_ = 0;
    s.stream.total_out = 0;
    s.stream.total_in = 0;
    s.stream.next_out = (uchar *)0x0;
    s.stream.next_in = (uchar *)0x0;
    s.stream.avail_in = 0;
    s.stream._12_4_ = 0;
    s.type = MINIZ_TYPE_NONE;
    iVar3 = MemoryStream::GetPosition(temp_writer);
    mVar7 = duckdb_miniz::mz_compressBound(iVar3);
    *compressed_size = mVar7 + 0x12;
    pAVar4 = BufferAllocator::Get(this->writer->context);
    Allocator::Allocate(&local_48,pAVar4,*compressed_size);
    AllocatedData::operator=(compressed_buf,&local_48);
    AllocatedData::~AllocatedData(&local_48);
    pdVar8 = MemoryStream::GetData(temp_writer);
    iVar3 = MemoryStream::GetPosition(temp_writer);
    MiniZStream::Compress(&s,(char *)pdVar8,iVar3,(char *)compressed_buf->pointer,compressed_size);
    *compressed_data = compressed_buf->pointer;
    MiniZStream::~MiniZStream(&s);
    break;
  default:
    pIVar9 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&s,"Unsupported codec for Parquet Writer",(allocator *)&local_48);
    InternalException::InternalException(pIVar9,(string *)&s);
    __cxa_throw(pIVar9,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case BROTLI:
    iVar3 = MemoryStream::GetPosition(temp_writer);
    sVar2 = duckdb_brotli::BrotliEncoderMaxCompressedSize(iVar3);
    *compressed_size = sVar2;
    pAVar4 = BufferAllocator::Get(this->writer->context);
    Allocator::Allocate((AllocatedData *)&s,pAVar4,*compressed_size);
    AllocatedData::operator=(compressed_buf,(AllocatedData *)&s);
    AllocatedData::~AllocatedData((AllocatedData *)&s);
    iVar3 = MemoryStream::GetPosition(temp_writer);
    pdVar8 = MemoryStream::GetData(temp_writer);
    duckdb_brotli::BrotliEncoderCompress
              (0xb,0x16,BROTLI_MODE_GENERIC,iVar3,pdVar8,compressed_size,compressed_buf->pointer);
    *compressed_data = compressed_buf->pointer;
    break;
  case ZSTD:
    iVar3 = MemoryStream::GetPosition(temp_writer);
    sVar2 = duckdb_zstd::ZSTD_compressBound(iVar3);
    *compressed_size = sVar2;
    pAVar4 = BufferAllocator::Get(this->writer->context);
    Allocator::Allocate((AllocatedData *)&s,pAVar4,*compressed_size);
    AllocatedData::operator=(compressed_buf,(AllocatedData *)&s);
    AllocatedData::~AllocatedData((AllocatedData *)&s);
    pdVar8 = compressed_buf->pointer;
    sVar2 = *compressed_size;
    pdVar5 = MemoryStream::GetData(temp_writer);
    iVar3 = MemoryStream::GetPosition(temp_writer);
    uVar6 = duckdb_zstd::ZSTD_compress
                      (pdVar8,sVar2,pdVar5,iVar3,(int)this->writer->compression_level);
    *compressed_size = uVar6;
    *compressed_data = compressed_buf->pointer;
    goto LAB_01df0c26;
  case LZ4_RAW:
    iVar3 = MemoryStream::GetPosition(temp_writer);
    iVar1 = duckdb_lz4::LZ4_compressBound((int)iVar3);
    *compressed_size = (long)iVar1;
    pAVar4 = BufferAllocator::Get(this->writer->context);
    Allocator::Allocate((AllocatedData *)&s,pAVar4,*compressed_size);
    AllocatedData::operator=(compressed_buf,(AllocatedData *)&s);
    AllocatedData::~AllocatedData((AllocatedData *)&s);
    pdVar5 = MemoryStream::GetData(temp_writer);
    pdVar8 = compressed_buf->pointer;
    iVar3 = MemoryStream::GetPosition(temp_writer);
    iVar1 = duckdb_lz4::LZ4_compress_default
                      ((char *)pdVar5,(char *)pdVar8,(int)iVar3,(int)*compressed_size);
    uVar6 = (ulong)iVar1;
    *compressed_size = uVar6;
    *compressed_data = compressed_buf->pointer;
    goto LAB_01df0c26;
  }
  uVar6 = *compressed_size;
LAB_01df0c26:
  if (uVar6 >> 0x1f == 0) {
    return;
  }
  pIVar9 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&s,"Parquet writer: %d compressed page size out of range for type integer",
             (allocator *)&local_48);
  iVar3 = MemoryStream::GetPosition(temp_writer);
  InternalException::InternalException<unsigned_long>(pIVar9,(string *)&s,iVar3);
  __cxa_throw(pIVar9,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ColumnWriter::CompressPage(MemoryStream &temp_writer, size_t &compressed_size, data_ptr_t &compressed_data,
                                AllocatedData &compressed_buf) {
	switch (writer.GetCodec()) {
	case CompressionCodec::UNCOMPRESSED:
		compressed_size = temp_writer.GetPosition();
		compressed_data = temp_writer.GetData();
		break;

	case CompressionCodec::SNAPPY: {
		compressed_size = duckdb_snappy::MaxCompressedLength(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		duckdb_snappy::RawCompress(const_char_ptr_cast(temp_writer.GetData()), temp_writer.GetPosition(),
		                           char_ptr_cast(compressed_buf.get()), &compressed_size);
		compressed_data = compressed_buf.get();
		D_ASSERT(compressed_size <= duckdb_snappy::MaxCompressedLength(temp_writer.GetPosition()));
		break;
	}
	case CompressionCodec::LZ4_RAW: {
		compressed_size = duckdb_lz4::LZ4_compressBound(UnsafeNumericCast<int32_t>(temp_writer.GetPosition()));
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		compressed_size = duckdb_lz4::LZ4_compress_default(
		    const_char_ptr_cast(temp_writer.GetData()), char_ptr_cast(compressed_buf.get()),
		    UnsafeNumericCast<int32_t>(temp_writer.GetPosition()), UnsafeNumericCast<int32_t>(compressed_size));
		compressed_data = compressed_buf.get();
		break;
	}
	case CompressionCodec::GZIP: {
		MiniZStream s;
		compressed_size = s.MaxCompressedLength(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		s.Compress(const_char_ptr_cast(temp_writer.GetData()), temp_writer.GetPosition(),
		           char_ptr_cast(compressed_buf.get()), &compressed_size);
		compressed_data = compressed_buf.get();
		break;
	}
	case CompressionCodec::ZSTD: {
		compressed_size = duckdb_zstd::ZSTD_compressBound(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		compressed_size = duckdb_zstd::ZSTD_compress((void *)compressed_buf.get(), compressed_size,
		                                             (const void *)temp_writer.GetData(), temp_writer.GetPosition(),
		                                             UnsafeNumericCast<int32_t>(writer.CompressionLevel()));
		compressed_data = compressed_buf.get();
		break;
	}
	case CompressionCodec::BROTLI: {
		compressed_size = duckdb_brotli::BrotliEncoderMaxCompressedSize(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		duckdb_brotli::BrotliEncoderCompress(BROTLI_DEFAULT_QUALITY, BROTLI_DEFAULT_WINDOW, BROTLI_DEFAULT_MODE,
		                                     temp_writer.GetPosition(), temp_writer.GetData(), &compressed_size,
		                                     compressed_buf.get());
		compressed_data = compressed_buf.get();
		break;
	}
	default:
		throw InternalException("Unsupported codec for Parquet Writer");
	}

	if (compressed_size > idx_t(NumericLimits<int32_t>::Maximum())) {
		throw InternalException("Parquet writer: %d compressed page size out of range for type integer",
		                        temp_writer.GetPosition());
	}
}